

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::Attribute
          (FormattingScene *this,string *target,ParsedParameterVector params,FileLoc loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  char local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ParameterDictionary local_e8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  local_108._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX,(polymorphic_allocator<pbrt::ParsedParameter_*> *)&local_108);
  ParameterDictionary::ParameterDictionary(&local_e8,&local_80,RGBColorSpace::sRGB);
  local_80.nStored = 0;
  (*(local_80.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_80.alloc.memoryResource,local_80.ptr,local_80.nAlloc << 3,8);
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct
            ((ulong)&local_108,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sAttribute \"%s\" ",&local_108,target);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (in_RDX->nStored == 1) {
    ParameterDictionary::ToParameterList_abi_cxx11_(&local_108,&local_e8,0);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_108._M_dataplus._M_p,local_108._M_string_length)
    ;
    local_109 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_109,1);
  }
  else {
    local_108._M_dataplus._M_p._0_1_ = 10;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)&local_108,1);
    ParameterDictionary::ToParameterList_abi_cxx11_
              (&local_108,&local_e8,*(int *)&(this->super_SceneRepresentation).field_0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,local_108._M_dataplus._M_p,local_108._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_e8.params.nStored = 0;
  (*(local_e8.params.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_e8.params.alloc.memoryResource,local_e8.params.ptr,local_e8.params.nAlloc << 3,8)
  ;
  return;
}

Assistant:

void FormattingScene::Attribute(const std::string &target, ParsedParameterVector params,
                                FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    Printf("%sAttribute \"%s\" ", indent(), target);
    if (params.size() == 1)
        // just one; put it on the same line
        std::cout << dict.ToParameterList(0) << '\n';
    else
        std::cout << '\n' << dict.ToParameterList(catIndentCount);
}